

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int jsonEachFilter(sqlite3_vtab_cursor *cur,int idxNum,char *idxStr,int argc,sqlite3_value **argv)

{
  JsonParse *pParse;
  int iVar1;
  int iVar2;
  u32 i;
  u32 uVar3;
  sqlite3_vtab *psVar4;
  char *pcVar5;
  size_t sVar6;
  int iVar7;
  long in_FS_OFFSET;
  u32 sz;
  u32 local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0xaaaaaaaa;
  jsonEachCursorReset((JsonEachCursor *)cur);
  iVar2 = 0;
  iVar7 = 0;
  if (idxNum == 0) goto LAB_002004a4;
  pParse = (JsonParse *)(cur + 0x18);
  cur[0x1c].pVtab = (sqlite3_vtab *)0x0;
  cur[0x1d].pVtab = (sqlite3_vtab *)0x0;
  cur[0x1a].pVtab = (sqlite3_vtab *)0x0;
  cur[0x1b].pVtab = (sqlite3_vtab *)0x0;
  cur[0x1e].pVtab = (sqlite3_vtab *)0x0;
  cur[0x1f].pVtab = (sqlite3_vtab *)0x0;
  cur[0x18].pVtab = (sqlite3_vtab *)0x0;
  cur[0x19].pVtab = (sqlite3_vtab *)0x0;
  cur[0x20].pVtab = (sqlite3_vtab *)0x0;
  *(undefined4 *)((long)&cur[0x1c].pVtab + 4) = 1;
  cur[0x1b].pVtab = cur[6].pVtab;
  iVar1 = jsonFuncArgMightBeBinary(*argv);
  iVar7 = iVar2;
  if (iVar1 == 0) {
    psVar4 = (sqlite3_vtab *)sqlite3ValueText(*argv,'\x01');
    cur[0x1a].pVtab = psVar4;
    iVar2 = sqlite3ValueBytes(*argv,'\x01');
    *(int *)&cur[0x1c].pVtab = iVar2;
    if (cur[0x1a].pVtab == (sqlite3_vtab *)0x0) {
      *(undefined8 *)((long)&cur[1].pVtab + 4) = 0;
      goto LAB_002004a4;
    }
    iVar2 = jsonConvertTextToBlob(pParse,(sqlite3_context *)0x0);
    if (iVar2 == 0) goto LAB_002002a4;
    iVar7 = 7;
    if (*(char *)((long)&cur[0x1d].pVtab + 7) != '\0') goto LAB_002004a4;
    sqlite3_free(cur->pVtab->zErrMsg);
    pcVar5 = sqlite3_mprintf("malformed JSON");
LAB_00200480:
    cur->pVtab->zErrMsg = pcVar5;
    jsonEachCursorReset((JsonEachCursor *)cur);
    iVar7 = 1;
    if (cur->pVtab->zErrMsg == (char *)0x0) {
      iVar7 = 7;
    }
  }
  else {
    iVar2 = sqlite3ValueBytes(*argv,'\x01');
    *(int *)&cur[0x19].pVtab = iVar2;
    psVar4 = (sqlite3_vtab *)sqlite3_value_blob(*argv);
    cur[0x18].pVtab = psVar4;
LAB_002002a4:
    if (idxNum == 3) {
      pcVar5 = (char *)sqlite3ValueText(argv[1],'\x01');
      if (pcVar5 == (char *)0x0) goto LAB_002004a4;
      if (*pcVar5 != '$') {
LAB_00200463:
        sqlite3_free(cur->pVtab->zErrMsg);
        pcVar5 = sqlite3_mprintf("bad JSON path: %Q",pcVar5);
        goto LAB_00200480;
      }
      sVar6 = strlen(pcVar5);
      *(uint *)((long)&cur[2].pVtab + 4) = (uint)sVar6 & 0x3fffffff;
      if (pcVar5[1] == '\0') {
        *(undefined4 *)((long)&cur[1].pVtab + 4) = 0;
        *(undefined1 *)&cur[3].pVtab = 0;
        i = 0;
      }
      else {
        i = jsonLookupStep(pParse,0,pcVar5 + 1,0);
        if (0xfffffffc < i) {
          if (i == 0xfffffffe) {
            *(undefined8 *)((long)&cur[1].pVtab + 4) = 0;
            *(undefined1 *)&cur[3].pVtab = 0;
            iVar7 = 0;
            goto LAB_002004a4;
          }
          goto LAB_00200463;
        }
        iVar2 = *(int *)((long)&cur[0x1f].pVtab + 4);
        if (iVar2 == 0) {
          *(u32 *)((long)&cur[1].pVtab + 4) = i;
          *(undefined1 *)&cur[3].pVtab = 0xb;
        }
        else {
          *(int *)((long)&cur[1].pVtab + 4) = iVar2;
          *(undefined1 *)&cur[3].pVtab = 0xc;
        }
      }
      jsonAppendRaw((JsonString *)(cur + 7),pcVar5,*(u32 *)((long)&cur[2].pVtab + 4));
    }
    else {
      *(undefined4 *)((long)&cur[1].pVtab + 4) = 0;
      *(undefined1 *)&cur[3].pVtab = 0;
      *(undefined4 *)((long)&cur[2].pVtab + 4) = 1;
      jsonAppendRaw((JsonString *)(cur + 7),"$",1);
      i = 0;
    }
    *(undefined4 *)((long)&cur[3].pVtab + 4) = 0;
    uVar3 = jsonbPayloadSize(pParse,i,&local_34);
    *(u32 *)&cur[2].pVtab = local_34 + uVar3 + i;
    psVar4 = cur[0x18].pVtab;
    if ((10 < (*(byte *)((long)&psVar4->pModule + (ulong)i) & 0xf)) &&
       (*(char *)((long)&cur[3].pVtab + 1) == '\0')) {
      *(u32 *)((long)&cur[1].pVtab + 4) = uVar3 + i;
      *(byte *)&cur[3].pVtab = *(byte *)((long)&psVar4->pModule + (ulong)i) & 0xf;
      psVar4 = (sqlite3_vtab *)sqlite3DbMallocZero((sqlite3 *)cur[6].pVtab,0x18);
      cur[5].pVtab = psVar4;
      if (psVar4 == (sqlite3_vtab *)0x0) {
        iVar7 = 7;
      }
      else {
        *(undefined8 *)((long)&cur[3].pVtab + 4) = 0x100000001;
        psVar4->zErrMsg = (char *)0x0;
        psVar4->nRef = *(int *)&cur[2].pVtab;
        *(undefined4 *)&psVar4->pModule = *(undefined4 *)((long)&cur[1].pVtab + 4);
        *(u32 *)((long)&psVar4->pModule + 4) = i;
      }
    }
  }
LAB_002004a4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

static int jsonEachFilter(
  sqlite3_vtab_cursor *cur,
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  const char *zRoot = 0;
  u32 i, n, sz;

  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(argc);
  jsonEachCursorReset(p);
  if( idxNum==0 ) return SQLITE_OK;
  memset(&p->sParse, 0, sizeof(p->sParse));
  p->sParse.nJPRef = 1;
  p->sParse.db = p->db;
  if( jsonFuncArgMightBeBinary(argv[0]) ){
    p->sParse.nBlob = sqlite3_value_bytes(argv[0]);
    p->sParse.aBlob = (u8*)sqlite3_value_blob(argv[0]);
  }else{
    p->sParse.zJson = (char*)sqlite3_value_text(argv[0]);
    p->sParse.nJson = sqlite3_value_bytes(argv[0]);
    if( p->sParse.zJson==0 ){
      p->i = p->iEnd = 0;
      return SQLITE_OK;
    }
    if( jsonConvertTextToBlob(&p->sParse, 0) ){
      if( p->sParse.oom ){
        return SQLITE_NOMEM;
      }
      goto json_each_malformed_input;
    }
  }
  if( idxNum==3 ){
    zRoot = (const char*)sqlite3_value_text(argv[1]);
    if( zRoot==0 ) return SQLITE_OK;
    if( zRoot[0]!='$' ){
      sqlite3_free(cur->pVtab->zErrMsg);
      cur->pVtab->zErrMsg = jsonBadPathError(0, zRoot);
      jsonEachCursorReset(p);
      return cur->pVtab->zErrMsg ? SQLITE_ERROR : SQLITE_NOMEM;
    }
    p->nRoot = sqlite3Strlen30(zRoot);
    if( zRoot[1]==0 ){
      i = p->i = 0;
      p->eType = 0;
    }else{
      i = jsonLookupStep(&p->sParse, 0, zRoot+1, 0);
      if( JSON_LOOKUP_ISERROR(i) ){
        if( i==JSON_LOOKUP_NOTFOUND ){
          p->i = 0;
          p->eType = 0;
          p->iEnd = 0;
          return SQLITE_OK;
        }
        sqlite3_free(cur->pVtab->zErrMsg);
        cur->pVtab->zErrMsg = jsonBadPathError(0, zRoot);
        jsonEachCursorReset(p);
        return cur->pVtab->zErrMsg ? SQLITE_ERROR : SQLITE_NOMEM;
      }
      if( p->sParse.iLabel ){
        p->i = p->sParse.iLabel;
        p->eType = JSONB_OBJECT;
      }else{
        p->i = i;
        p->eType = JSONB_ARRAY;
      }
    }
    jsonAppendRaw(&p->path, zRoot, p->nRoot);
  }else{
    i = p->i = 0;
    p->eType = 0;
    p->nRoot = 1;
    jsonAppendRaw(&p->path, "$", 1);
  }
  p->nParent = 0;
  n = jsonbPayloadSize(&p->sParse, i, &sz);
  p->iEnd = i+n+sz;
  if( (p->sParse.aBlob[i] & 0x0f)>=JSONB_ARRAY && !p->bRecursive ){
    p->i = i + n;
    p->eType = p->sParse.aBlob[i] & 0x0f;
    p->aParent = sqlite3DbMallocZero(p->db, sizeof(JsonParent));
    if( p->aParent==0 ) return SQLITE_NOMEM;
    p->nParent = 1;
    p->nParentAlloc = 1;
    p->aParent[0].iKey = 0;
    p->aParent[0].iEnd = p->iEnd;
    p->aParent[0].iHead = p->i;
    p->aParent[0].iValue = i;
  }
  return SQLITE_OK;

json_each_malformed_input:
  sqlite3_free(cur->pVtab->zErrMsg);
  cur->pVtab->zErrMsg = sqlite3_mprintf("malformed JSON");
  jsonEachCursorReset(p);
  return cur->pVtab->zErrMsg ? SQLITE_ERROR : SQLITE_NOMEM;
}